

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcryptohash-sha1.c
# Opt level: O1

void p_crypto_hash_sha1_reset(PHashSHA1 *ctx)

{
  *(undefined8 *)((long)&ctx->buf + 0x30) = 0;
  *(undefined8 *)((long)&ctx->buf + 0x38) = 0;
  *(undefined8 *)((long)&ctx->buf + 0x20) = 0;
  *(undefined8 *)((long)&ctx->buf + 0x28) = 0;
  *(undefined8 *)((long)&ctx->buf + 0x10) = 0;
  *(undefined8 *)((long)&ctx->buf + 0x18) = 0;
  *(undefined8 *)&ctx->buf = 0;
  *(undefined8 *)((long)&ctx->buf + 8) = 0;
  ctx->len_low = 0;
  ctx->hash[0] = 0x67452301;
  ctx->hash[1] = 0xefcdab89;
  ctx->hash[2] = 0x98badcfe;
  ctx->hash[3] = 0x10325476;
  *(undefined8 *)(ctx->hash + 4) = 0xc3d2e1f0;
  return;
}

Assistant:

void
p_crypto_hash_sha1_reset (PHashSHA1 *ctx)
{
	memset (ctx->buf.buf, 0, 64);

	ctx->len_low = 0;
	ctx->len_high = 0;

	ctx->hash[0] = 0x67452301;
	ctx->hash[1] = 0xEFCDAB89;
	ctx->hash[2] = 0x98BADCFE;
	ctx->hash[3] = 0x10325476;
	ctx->hash[4] = 0xC3D2E1F0;
}